

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void appendAllPathElements(DbPath *pPath,char *zPath)

{
  char *__src;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int iLine;
  char *pcVar6;
  char *zFunc;
  long lVar7;
  int iVar8;
  long in_FS_OFFSET;
  stat buf;
  undefined1 local_10d8 [24];
  uint local_10c0;
  char local_1048 [4112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = 0;
  do {
    __src = zPath + iVar8;
    for (lVar7 = 0; (__src[lVar7] != '\0' && (__src[lVar7] != '/')); lVar7 = lVar7 + 1) {
    }
    uVar1 = (uint)lVar7;
    if (iVar8 < (int)(iVar8 + uVar1)) {
      if (zPath[iVar8] == '.') {
        if (uVar1 != 1) {
          uVar2 = pPath->nUsed;
          if ((uVar1 != 2) || (__src[1] != '.')) goto LAB_00125b68;
          if (1 < (int)uVar2) {
            pcVar6 = pPath->zOut + uVar2;
            do {
              uVar2 = uVar2 - 1;
              pcVar6 = pcVar6 + -1;
              pPath->nUsed = uVar2;
            } while (*pcVar6 != '/');
            goto LAB_00125c05;
          }
          goto LAB_00125bfe;
        }
      }
      else {
        uVar2 = pPath->nUsed;
LAB_00125b68:
        if ((int)(uVar2 + uVar1 + 2) < pPath->nOut) {
          pPath->nUsed = uVar2 + 1;
          pPath->zOut[(int)uVar2] = '/';
          memcpy(pPath->zOut + pPath->nUsed,__src,(long)(int)uVar1);
          iVar3 = pPath->nUsed + uVar1;
          pPath->nUsed = iVar3;
          if (pPath->rc == 0) {
            pPath->zOut[iVar3] = '\0';
            pcVar6 = pPath->zOut;
            iVar3 = (*aSyscall[0x1b].pCurrent)(pcVar6,local_10d8);
            if (iVar3 == 0) {
              if ((local_10c0 & 0xf000) == 0xa000) {
                iVar3 = pPath->nSymlink;
                pPath->nSymlink = iVar3 + 1;
                if (200 < iVar3) {
                  iVar3 = sqlite3CantopenError(0xa3ef);
                  goto LAB_00125c4c;
                }
                lVar5 = (*aSyscall[0x1a].pCurrent)(pcVar6,local_1048,0x1000);
                if (lVar5 - 0x1000U < 0xfffffffffffff001) {
                  iVar3 = sqlite3CantopenError(0xa3f4);
                  zFunc = "readlink";
                  iLine = 0xa3f4;
                  goto LAB_00125bf7;
                }
                local_1048[lVar5] = '\0';
                iVar3 = 0;
                if (local_1048[0] != '/') {
                  iVar3 = ~uVar1 + pPath->nUsed;
                }
                pPath->nUsed = iVar3;
                appendAllPathElements(pPath,local_1048);
              }
            }
            else {
              piVar4 = __errno_location();
              if (*piVar4 != 2) {
                iVar3 = sqlite3CantopenError(0xa3e9);
                zFunc = "lstat";
                iLine = 0xa3e9;
LAB_00125bf7:
                unixLogErrorAtLine(iVar3,zFunc,pcVar6,iLine);
LAB_00125c4c:
                pPath->rc = iVar3;
              }
            }
          }
        }
        else {
LAB_00125bfe:
          pPath->rc = 1;
        }
      }
    }
LAB_00125c05:
    iVar8 = iVar8 + uVar1 + 1;
    if (__src[lVar7] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

static void appendAllPathElements(
  DbPath *pPath,       /* Path under construction, to which to append zName */
  const char *zPath    /* Path to append to pPath.  Is zero-terminated */
){
  int i = 0;
  int j = 0;
  do{
    while( zPath[i] && zPath[i]!='/' ){ i++; }
    if( i>j ){
      appendOnePathElement(pPath, &zPath[j], i-j);
    }
    j = i+1;
  }while( zPath[i++] );
}